

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

void __thiscall
InProcNativeEntryPointData::SetSortedLazyBailOutRecordList
          (InProcNativeEntryPointData *this,
          List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *sortedLazyBailOutRecordList)

{
  Type pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  HeapAllocator *alloc;
  List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  int i;
  long lVar6;
  long lVar7;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (this->sortedLazyBailoutRecordList != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1bb,"(this->sortedLazyBailoutRecordList == nullptr)",
                       "this->sortedLazyBailoutRecordList == nullptr");
    if (!bVar3) goto LAB_00611ce9;
    *puVar4 = 0;
  }
  if (sortedLazyBailOutRecordList ==
      (List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1c1,"(sortedLazyBailOutRecordList != nullptr)",
                       "sortedLazyBailOutRecordList != nullptr");
    if (!bVar3) {
LAB_00611ce9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  data._32_8_ = this;
  if (1 < (sortedLazyBailOutRecordList->
          super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).count) {
    lVar6 = 1;
    lVar7 = 0x10;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pLVar1 = (sortedLazyBailOutRecordList->
               super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).
               buffer;
      pTVar5 = JsUtil::
               List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(sortedLazyBailOutRecordList,(int)lVar6 + -1);
      if (*(uint *)((long)&pLVar1->offset + lVar7) <= pTVar5->offset) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                           ,0x1ca,"(currentRecord.offset > previousRecord.offset)",
                           "Lazy bailout record list isn\'t sorted by offset?");
        if (!bVar3) goto LAB_00611ce9;
        *puVar4 = 0;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < (sortedLazyBailOutRecordList->
                     super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>)
                     .count);
  }
  local_60 = (undefined1  [8])
             &JsUtil::
              List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_1c549c0;
  data.filename._0_4_ = 0x1d0;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  this_00 = (List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
             *)new<Memory::HeapAllocator>(0x30,alloc,0x300d4a);
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined4 *)(this_00 + 0x10) = 0;
  *(HeapAllocator **)(this_00 + 0x18) = &Memory::HeapAllocator::Instance;
  *(undefined ***)this_00 = &PTR_IsReadOnly_014ed5b8;
  *(undefined8 *)(this_00 + 0x20) = 0x400000000;
  *(List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
   (data._32_8_ + 0xd0) = this_00;
  JsUtil::List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Copy<JsUtil::List<LazyBailOutRecord,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
            (this_00,sortedLazyBailOutRecordList);
  return;
}

Assistant:

void 
InProcNativeEntryPointData::SetSortedLazyBailOutRecordList(JsUtil::List<LazyBailOutRecord, ArenaAllocator> *sortedLazyBailOutRecordList)
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
    Assert(this->sortedLazyBailoutRecordList == nullptr);

#if DBG

    // Making sure the list is sorted

    Assert(sortedLazyBailOutRecordList != nullptr);
    if (sortedLazyBailOutRecordList->Count() >= 2)
    {
        sortedLazyBailOutRecordList->MapFrom(1, [=](int index, const LazyBailOutRecord& currentRecord)
        {
            const LazyBailOutRecord& previousRecord = sortedLazyBailOutRecordList->Item(index - 1);
            AssertMsg(
                currentRecord.offset > previousRecord.offset,
                "Lazy bailout record list isn't sorted by offset?"
            );
        });
    }

#endif

    this->sortedLazyBailoutRecordList = HeapNew(NativeLazyBailOutRecordList, &HeapAllocator::Instance);
    this->sortedLazyBailoutRecordList->Copy(sortedLazyBailOutRecordList);
}